

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

bool Am_Object_Valid_And_Not_Part(Am_Object *obj)

{
  bool bVar1;
  Am_Value *this;
  Am_Object local_20;
  Am_Object *local_18;
  Am_Object *obj_local;
  
  local_18 = obj;
  bVar1 = Am_Object::Valid(obj);
  if (bVar1) {
    this = Am_Object::Get(obj,0x69,0);
    bVar1 = Am_Value::operator_cast_to_bool(this);
    if (bVar1) {
      Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)obj);
      bVar1 = Am_Object::Valid(&local_20);
      Am_Object::~Am_Object(&local_20);
      if (bVar1) {
        obj_local._7_1_ = false;
      }
      else {
        obj_local._7_1_ = true;
      }
    }
    else {
      obj_local._7_1_ = false;
    }
  }
  else {
    obj_local._7_1_ = false;
  }
  return obj_local._7_1_;
}

Assistant:

bool
Am_Object_Valid_And_Not_Part(Am_Object obj)
{
  if (!obj.Valid())
    return false;
  if (!(bool)obj.Get(Am_VISIBLE))
    return false;
  if (obj.Get_Owner().Valid())
    return false; // shouldn't have an owner
  return true;
}